

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int exhaustive_parse(Parser *p,int state)

{
  uint32 *puVar1;
  char *pcVar2;
  uint *puVar3;
  Shift **ppSVar4;
  d_loc_t *start_loc;
  Shift **ppSVar5;
  anon_struct_40_4_d8687ec6_for_error_reductions *v;
  int *piVar6;
  char cVar7;
  unsigned_short uVar8;
  undefined2 uVar9;
  char *pcVar10;
  D_ErrorRecoveryHint *pDVar11;
  char *pcVar12;
  SNode *pSVar13;
  D_Reduction **ppDVar14;
  SNode **ppSVar15;
  SNode **ppSVar16;
  ZNode **ppZVar17;
  D_State *pDVar18;
  long lVar19;
  d_loc_t *pdVar20;
  SNode *pSVar21;
  bool bVar22;
  D_Shift *pDVar23;
  Shift *__ptr;
  Shift *pSVar24;
  D_ErrorRecoveryHint *pDVar25;
  Shift *pSVar26;
  char cVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  SNode *pSVar31;
  PNode *pPVar32;
  ZNode *pZVar33;
  void *__ptr_00;
  size_t sVar34;
  D_Reduction *elem;
  Reduction *pRVar35;
  ShiftResult *pSVar36;
  D_Shift *pDVar37;
  ZNode *pZVar38;
  uint uVar39;
  int iVar40;
  D_Shift **ppDVar41;
  int iVar42;
  Shift **ppSVar43;
  D_ErrorRecoveryHint *pDVar44;
  long lVar45;
  VecSNode *v_00;
  ShiftResult *pSVar46;
  ulong uVar47;
  long lVar48;
  uint uVar49;
  Shift *pSVar50;
  ulong uVar51;
  Shift *pSVar52;
  char *pcVar53;
  char *pcVar54;
  ulong uVar55;
  D_Shift **ppDVar56;
  ulong uVar57;
  long *plVar58;
  d_loc_t loc_1;
  d_loc_t loc;
  PNode tpn;
  SNode *local_1e8;
  char *local_1c0;
  D_ErrorRecoveryHint *local_1a8;
  d_loc_t local_198;
  D_Reduction **local_170;
  void *local_168;
  ulong local_160;
  d_loc_t local_158;
  ulong local_130;
  d_loc_t local_128;
  PNode local_108;
  
  pcVar53 = p->start;
  (p->user).loc.s = pcVar53;
  (p->user).loc.ws = pcVar53;
  local_128.ws = (p->user).loc.ws;
  local_128.col = (p->user).loc.col;
  local_128.line = (p->user).loc.line;
  local_128.s = (p->user).loc.s;
  local_128.pathname = (p->user).loc.pathname;
  (*(p->user).initial_white_space_fn)(&p->user,&local_128,(void **)p);
  pSVar31 = add_SNode(p,p->t->state + state,&local_128,p->top_scope);
  memset(&local_108,0,0xd8);
  local_108.initial_scope = p->top_scope;
  local_108.parse_node.end = local_128.s;
  pPVar32 = pSVar31->last_pn;
  local_108.parse_node.scope = local_108.initial_scope;
  if (pPVar32 != (PNode *)0x0) {
    puVar1 = &pPVar32->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pPVar32);
    }
  }
  start_loc = &(p->user).loc;
  pPVar32 = add_PNode(p,0,&local_128,local_128.s,&local_108,(D_Reduction *)0x0,(VecZNode *)0x0,
                      (D_Shift *)0x0);
  pPVar32->refcount = pPVar32->refcount + 1;
  pSVar31->last_pn = pPVar32;
  pZVar33 = new_ZNode(p,pPVar32);
  set_add_znode(&pSVar31->zns,pZVar33);
  ppSVar5 = &p->shifts_todo;
  v = &p->error_reductions;
  local_170 = (p->error_reductions).e;
  pcVar53 = (char *)0x0;
  iVar42 = 0;
LAB_00144a12:
  if (p->reductions_todo != (Reduction *)0x0) {
    pcVar10 = (p->reductions_todo->snode->loc).s;
    if ((p->shifts_todo == (Shift *)0x0) || (pcVar10 <= (p->shifts_todo->snode->loc).s)) {
      if (pcVar53 < pcVar10) {
        free_old_nodes(p);
        pcVar53 = pcVar10;
      }
      while ((pRVar35 = p->reductions_todo, pRVar35 != (Reduction *)0x0 &&
             ((pRVar35->snode->loc).s == pcVar10))) {
        p->reductions_todo = pRVar35->next;
        reduce_one(p,pRVar35);
      }
      goto LAB_00144a12;
    }
  }
  pSVar50 = *ppSVar5;
  if (pSVar50 == (Shift *)0x0) {
    if (p->accept != (SNode *)0x0) {
      if ((p->accept->loc).s == p->end) {
        return 0;
      }
      if ((p->user).partial_parses != 0) {
        return 0;
      }
    }
    pSVar31 = (p->snode_hash).last_all;
    if (pSVar31 == (SNode *)0x0) {
      return 1;
    }
    pcVar10 = (pSVar31->loc).s;
    pcVar12 = (pSVar31->loc).pathname;
    iVar40 = (pSVar31->loc).col;
    iVar29 = (pSVar31->loc).line;
    (p->user).loc.ws = (pSVar31->loc).ws;
    (p->user).loc.col = iVar40;
    (p->user).loc.line = iVar29;
    start_loc->s = pcVar10;
    (p->user).loc.pathname = pcVar12;
    if ((p->user).error_recovery == 0) {
      return 1;
    }
    __ptr_00 = malloc(80000);
    iVar40 = (p->user).loc.line;
    if (p->last_syntax_error_line < iVar40) {
      p->last_syntax_error_line = iVar40;
      piVar6 = &(p->user).syntax_errors;
      *piVar6 = *piVar6 + 1;
      (*(p->user).syntax_error_fn)(&p->user);
    }
    uVar49 = 0;
    for (pSVar31 = (p->snode_hash).last_all; pSVar31 != (SNode *)0x0; pSVar31 = pSVar31->all_next) {
      if (-1 < (int)*(uint *)&pSVar31->field_0x24) {
        *(uint *)&pSVar31->field_0x24 = *(uint *)&pSVar31->field_0x24 | 0x80000000;
        if (uVar49 < 9999) {
          uVar51 = (ulong)uVar49;
          uVar49 = uVar49 + 1;
          *(SNode **)((long)__ptr_00 + uVar51 * 8) = pSVar31;
        }
        else {
          exhaustive_parse_cold_1();
        }
      }
    }
    if (uVar49 == 0) {
      local_1a8 = (D_ErrorRecoveryHint *)0x0;
      local_1c0 = (char *)0x0;
      local_1e8 = (SNode *)0x0;
    }
    else {
      pcVar10 = (((p->snode_hash).last_all)->loc).s;
      uVar51 = 0;
      local_1e8 = (SNode *)0x0;
      local_1c0 = (char *)0x0;
      local_1a8 = (D_ErrorRecoveryHint *)0x0;
      local_168 = __ptr_00;
      do {
        pSVar31 = *(SNode **)((long)__ptr_00 + uVar51 * 8);
        local_130 = (ulong)(pSVar31->state->error_recovery_hints).n;
        local_160 = uVar51;
        if (local_130 != 0) {
          pDVar11 = (pSVar31->state->error_recovery_hints).v;
          cVar7 = *pcVar10;
          uVar51 = 0;
          do {
            pcVar12 = pDVar11[uVar51].string;
            sVar34 = strlen(pcVar12);
            uVar55 = sVar34 & 0xffffffff;
            pcVar54 = pcVar10;
            cVar27 = cVar7;
            if (uVar55 == 1) {
              if (cVar7 != '\0') {
                do {
                  if (cVar27 == *pcVar12) break;
                  cVar27 = pcVar54[1];
                  pcVar54 = pcVar54 + 1;
                } while (cVar27 != '\0');
              }
              pcVar54 = pcVar54 + 1;
              if (cVar27 != *pcVar12) {
                pcVar54 = (char *)0x0;
              }
            }
            else {
              while (cVar27 != '\0') {
                iVar40 = strncmp(pcVar12,pcVar54,uVar55);
                if (iVar40 == 0) {
                  pcVar54 = pcVar54 + uVar55;
                  goto LAB_00144c7f;
                }
                pcVar2 = pcVar54 + 1;
                pcVar54 = pcVar54 + 1;
                cVar27 = *pcVar2;
              }
              pcVar54 = (char *)0x0;
            }
LAB_00144c7f:
            pSVar13 = local_1e8;
            pcVar12 = local_1c0;
            pDVar25 = local_1a8;
            if (((pcVar54 != (char *)0x0) &&
                (pDVar44 = pDVar11 + uVar51, pSVar13 = pSVar31, pcVar12 = pcVar54, pDVar25 = pDVar44
                , local_1e8 != (SNode *)0x0)) &&
               ((((local_1c0 <= pcVar54 &&
                  ((pSVar13 = local_1e8, pcVar12 = local_1c0, pDVar25 = local_1a8,
                   pcVar54 == local_1c0 &&
                   (uVar28 = *(uint *)&local_1e8->field_0x24 & 0x7fffffff,
                   uVar39 = *(uint *)&pSVar31->field_0x24 & 0x7fffffff, pSVar13 = pSVar31,
                   pcVar12 = pcVar54, pDVar25 = pDVar44, uVar39 <= uVar28)))) &&
                 (pSVar13 = local_1e8, pcVar12 = local_1c0, pDVar25 = local_1a8, uVar28 == uVar39))
                && (pSVar13 = pSVar31, pcVar12 = pcVar54, pDVar25 = pDVar44,
                   pDVar44->depth <= local_1a8->depth)))) {
              pSVar13 = local_1e8;
              pcVar12 = local_1c0;
              pDVar25 = local_1a8;
            }
            local_1a8 = pDVar25;
            local_1c0 = pcVar12;
            local_1e8 = pSVar13;
            uVar51 = uVar51 + 1;
          } while (uVar51 != local_130);
        }
        uVar51 = local_160;
        __ptr_00 = local_168;
        if ((pSVar31->zns).n != 0) {
          uVar55 = 0;
          do {
            pZVar33 = (pSVar31->zns).v[uVar55];
            if ((pZVar33 != (ZNode *)0x0) && ((pZVar33->sns).n != 0)) {
              uVar57 = 0;
              do {
                pSVar13 = (pZVar33->sns).v[uVar57];
                if (-1 < (int)*(uint *)&pSVar13->field_0x24) {
                  *(uint *)&pSVar13->field_0x24 = *(uint *)&pSVar13->field_0x24 | 0x80000000;
                  if (uVar49 < 9999) {
                    uVar47 = (ulong)uVar49;
                    uVar49 = uVar49 + 1;
                    *(SNode **)((long)__ptr_00 + uVar47 * 8) = pSVar13;
                  }
                  else {
                    exhaustive_parse_cold_2();
                  }
                }
                uVar57 = uVar57 + 1;
                pZVar33 = (pSVar31->zns).v[uVar55];
              } while (uVar57 < (pZVar33->sns).n);
            }
            uVar55 = uVar55 + 1;
          } while (uVar55 < (pSVar31->zns).n);
        }
        uVar51 = uVar51 + 1;
      } while (uVar51 < uVar49);
    }
    if (uVar49 != 0) {
      uVar51 = 0;
      do {
        puVar3 = (uint *)(*(long *)((long)__ptr_00 + uVar51 * 8) + 0x24);
        *puVar3 = *puVar3 & 0x7fffffff;
        uVar51 = uVar51 + 1;
      } while (uVar49 != uVar51);
    }
    if (local_1e8 == (SNode *)0x0) goto LAB_00145855;
    elem = (D_Reduction *)malloc(0x38);
    pRVar35 = (Reduction *)malloc(0x30);
    local_198.s = start_loc->s;
    local_198.pathname = (p->user).loc.pathname;
    local_198.ws = (p->user).loc.ws;
    local_198.col = (p->user).loc.col;
    local_198.line = (p->user).loc.line;
    elem->rule_priority = 0;
    elem->action_index = 0;
    *(undefined8 *)&elem->npass_code = 0;
    elem->final_code = (D_ReductionCode)0x0;
    elem->op_assoc = 0;
    elem->rule_assoc = 0;
    elem->op_priority = 0;
    elem->nelements = 0;
    elem->symbol = 0;
    *(undefined4 *)&elem->field_0x4 = 0;
    elem->speculative_code = (D_ReductionCode)0x0;
    elem->pass_code = (D_ReductionCode *)0x0;
    ppDVar14 = (p->error_reductions).v;
    if (ppDVar14 == (D_Reduction **)0x0) {
      (p->error_reductions).v = local_170;
      uVar49 = (p->error_reductions).n;
      (p->error_reductions).n = uVar49 + 1;
      (p->error_reductions).e[uVar49] = elem;
    }
    else {
      uVar49 = v->n;
      if (ppDVar14 == local_170) {
        if (2 < uVar49) goto LAB_00144e90;
      }
      else if ((uVar49 & 7) == 0) {
LAB_00144e90:
        vec_add_internal(v,elem);
        goto LAB_00144e9d;
      }
      v->n = uVar49 + 1;
      ppDVar14[uVar49] = elem;
    }
LAB_00144e9d:
    uVar9 = local_1a8->depth;
    elem->nelements = uVar9 + 1;
    elem->symbol = local_1a8->symbol;
    if (local_198.s < local_1c0) {
      iVar40 = local_198.line;
      do {
        if (*local_198.s == '\n') {
          iVar40 = iVar40 + 1;
          local_198.line = iVar40;
        }
        local_198.s = local_198.s + 1;
      } while (local_198.s != local_1c0);
    }
    local_198.s = local_1c0;
    uVar51 = (ulong)(local_1e8->zns).n;
    if (uVar51 == 0) {
      pPVar32 = (PNode *)0x0;
    }
    else {
      uVar55 = 0;
      pPVar32 = (PNode *)0x0;
      do {
        pZVar33 = (local_1e8->zns).v[uVar55];
        if ((pZVar33 != (ZNode *)0x0) &&
           ((pPVar32 == (PNode *)0x0 ||
            ((pPVar32->parse_node).start_loc.s < (pZVar33->pn->parse_node).start_loc.s)))) {
          pPVar32 = pZVar33->pn;
        }
        uVar55 = uVar55 + 1;
      } while (uVar51 != uVar55);
    }
    (*(p->user).initial_white_space_fn)(&p->user,&local_198,(void **)p);
    pPVar32 = add_PNode(p,0,start_loc,local_198.s,pPVar32,(D_Reduction *)0x0,(VecZNode *)0x0,
                        (D_Shift *)0x0);
    pSVar31 = new_SNode(p,local_1e8->state,&local_198,pPVar32->initial_scope);
    pPVar32->refcount = pPVar32->refcount + 1;
    pSVar31->last_pn = pPVar32;
    pZVar33 = new_ZNode(p,pPVar32);
    set_add_znode(&pSVar31->zns,pZVar33);
    ppSVar15 = (pZVar33->sns).v;
    ppSVar16 = (pZVar33->sns).e;
    if (ppSVar15 == (SNode **)0x0) {
      (pZVar33->sns).v = ppSVar16;
      uVar49 = (pZVar33->sns).n;
      (pZVar33->sns).n = uVar49 + 1;
      (pZVar33->sns).e[uVar49] = local_1e8;
    }
    else {
      v_00 = &pZVar33->sns;
      uVar49 = v_00->n;
      if (ppSVar15 == ppSVar16) {
        if (2 < uVar49) goto LAB_0014501c;
      }
      else if ((uVar49 & 7) == 0) {
LAB_0014501c:
        vec_add_internal(v_00,local_1e8);
        goto LAB_00145024;
      }
      v_00->n = uVar49 + 1;
      ppSVar15[uVar49] = local_1e8;
    }
LAB_00145024:
    local_1e8->refcount = local_1e8->refcount + 1;
    pRVar35->znode = pZVar33;
    pSVar31->refcount = pSVar31->refcount + 1;
    pRVar35->snode = pSVar31;
    pRVar35->reduction = elem;
    pRVar35->new_snode = (SNode *)0x0;
    pRVar35->next = (Reduction *)0x0;
    free_old_nodes(p);
    free_old_nodes(p);
    reduce_one(p,pRVar35);
    uVar51 = (ulong)(p->snode_hash).m;
    if (uVar51 != 0) {
      ppSVar16 = (p->snode_hash).v;
      uVar55 = 0;
      do {
        for (pSVar31 = ppSVar16[uVar55]; pSVar31 != (SNode *)0x0; pSVar31 = pSVar31->bucket_next) {
          uVar57 = (ulong)(pSVar31->zns).n;
          if (uVar57 != 0) {
            ppZVar17 = (pSVar31->zns).v;
            uVar47 = 0;
            do {
              pZVar33 = ppZVar17[uVar47];
              if ((pZVar33 != (ZNode *)0x0) && (pPVar32 = pZVar33->pn, pPVar32->reduction == elem))
              {
                pPVar32->evaluated = '\x01';
                pPVar32->error_recovery = '\x01';
              }
              uVar47 = uVar47 + 1;
            } while (uVar57 != uVar47);
          }
        }
        uVar55 = uVar55 + 1;
      } while (uVar55 != uVar51);
    }
    if ((*ppSVar5 == (Shift *)0x0) && (p->reductions_todo == (Reduction *)0x0)) {
LAB_00145855:
      free(__ptr_00);
      return 1;
    }
    free(__ptr_00);
  }
  else {
    if (((p->user).dont_compare_stacks == 0) && (pSVar50->next != (Shift *)0x0)) {
      pcVar10 = (pSVar50->snode->loc).s;
      ppSVar43 = ppSVar5;
      do {
        pSVar31 = pSVar50->snode;
        if ((pSVar31->loc).s != pcVar10) break;
        pZVar33 = binary_op_ZNode(pSVar31);
        if (pZVar33 != (ZNode *)0x0) {
          pSVar52 = pSVar50->next;
          pSVar26 = pSVar52;
          pSVar24 = pSVar50;
          while (__ptr = pSVar26, __ptr != (Shift *)0x0) {
            pSVar13 = __ptr->snode;
            if ((pSVar13->loc).s != pcVar10) break;
            pZVar38 = binary_op_ZNode(pSVar13);
            if (pZVar38 != (ZNode *)0x0) {
              uVar49 = (pZVar33->sns).n;
              uVar28 = (pZVar38->sns).n;
              uVar51 = (ulong)uVar28;
              if (uVar49 == uVar28) {
                if ((ulong)uVar49 != 0) {
                  if (uVar51 == 0) goto LAB_0014578a;
                  ppSVar16 = (pZVar38->sns).v;
                  uVar55 = 0;
                  do {
                    pSVar21 = (pZVar33->sns).v[uVar55];
                    if (pSVar21 != *ppSVar16) {
                      uVar57 = 0;
                      do {
                        if (uVar51 - 1 == uVar57) goto LAB_0014578a;
                        uVar47 = uVar57 + 1;
                        lVar45 = uVar57 + 1;
                        uVar57 = uVar47;
                      } while (pSVar21 != ppSVar16[lVar45]);
                      if (uVar51 <= uVar47) goto LAB_0014578a;
                    }
                    uVar55 = uVar55 + 1;
                  } while (uVar55 != uVar49);
                }
                pDVar18 = p->t->state;
                if ((((long)pSVar13->state - (long)pDVar18 >> 3) * -0x1111111111111111 -
                     (long)pSVar31->state->reduces_to == 0) ||
                   (((long)pSVar31->state - (long)pDVar18 >> 3) * -0x1111111111111111 -
                    (long)pSVar13->state->reduces_to == 0)) {
                  iVar40 = pZVar38->pn->op_priority;
                  iVar29 = pZVar33->pn->op_priority;
                  if (iVar40 < iVar29) {
                    pSVar24->next = __ptr->next;
                    pSVar31 = __ptr->snode;
                    puVar1 = &pSVar31->refcount;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      free_SNode(p,pSVar31);
                    }
                    free(__ptr);
                    break;
                  }
                  if (iVar29 < iVar40) {
                    *ppSVar43 = pSVar52;
                    pSVar31 = pSVar50->snode;
                    puVar1 = &pSVar31->refcount;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      free_SNode(p,pSVar31);
                    }
                    free(pSVar50);
                    pSVar50 = *ppSVar43;
                    break;
                  }
                }
              }
            }
LAB_0014578a:
            pSVar24 = __ptr;
            pSVar26 = __ptr->next;
          }
        }
        ppSVar4 = &pSVar50->next;
        ppSVar43 = &pSVar50->next;
        pSVar50 = *ppSVar4;
      } while (*ppSVar4 != (Shift *)0x0);
    }
    pcVar10 = ((*ppSVar5)->snode->loc).s;
    if (pcVar53 < pcVar10) {
      free_old_nodes(p);
      pcVar53 = pcVar10;
    }
    iVar29 = iVar42 + 1;
    iVar40 = (p->user).commit_actions_interval;
    bVar22 = iVar40 <= iVar42;
    if (iVar40 <= iVar42) {
      bVar22 = true;
      if (((*ppSVar5)->next == (Shift *)0x0) && (p->reductions_todo == (Reduction *)0x0)) {
        iVar42 = commit_stack(p,(*ppSVar5)->snode);
        iVar29 = 0;
        bVar22 = false;
        if (iVar42 == -4) {
          return -1;
        }
      }
    }
    pSVar50 = *ppSVar5;
    pSVar31 = pSVar50->snode;
    local_198.s = (pSVar31->loc).s;
    local_198.pathname = (pSVar31->loc).pathname;
    local_198.ws = (pSVar31->loc).ws;
    local_198.col = (pSVar31->loc).col;
    local_198.line = (pSVar31->loc).line;
    local_158.s = (char *)0x0;
    iVar42 = 0;
    uVar51 = 0;
    pSVar52 = pSVar50;
    do {
      uVar55 = uVar51;
      if ((pSVar52->snode->loc).s != pcVar10) break;
      iVar40 = (int)uVar51;
      uVar49 = p->t->nsymbols;
      if ((uint)(p->nshift_results - iVar40) < uVar49 * 2) {
        iVar30 = uVar49 * 3 + iVar40;
        p->nshift_results = iVar30;
        pSVar36 = (ShiftResult *)realloc(p->shift_results,(long)iVar30 * 0x30);
        p->shift_results = pSVar36;
      }
      p->shifts_todo = p->shifts_todo->next;
      p->scans = p->scans + 1;
      pDVar18 = pSVar52->snode->state;
      if (pDVar18->scanner_code != (D_ScanCode)0x0) {
        if (p->ncode_shifts <= iVar42) {
          p->ncode_shifts = iVar42 + 2;
          pDVar37 = (D_Shift *)realloc(p->code_shifts,(long)(iVar42 + 2) * 0x18);
          p->code_shifts = pDVar37;
        }
        pDVar37 = p->code_shifts;
        pDVar23 = pDVar37 + iVar42;
        pDVar23->shift_kind = '\0';
        pDVar23->op_assoc = '\0';
        pDVar37 = pDVar37 + iVar42;
        pDVar37->term_priority = 0;
        pDVar37->action_index = 0;
        *(D_ReductionCode *)(&pDVar37->term_priority + 2) = (D_ReductionCode)0x0;
        pSVar36 = p->shift_results;
        pdVar20 = &pSVar36[uVar51].loc;
        *(undefined4 *)&pdVar20->ws = local_198.ws._0_4_;
        *(undefined4 *)((long)&pdVar20->ws + 4) = local_198.ws._4_4_;
        *(int *)(&pdVar20->ws + 1) = local_198.col;
        pdVar20->line = local_198.line;
        pdVar20 = &pSVar36[uVar51].loc;
        *(undefined4 *)&pdVar20->s = local_198.s._0_4_;
        *(undefined4 *)((long)&pdVar20->s + 4) = local_198.s._4_4_;
        *(undefined4 *)&pdVar20->pathname = local_198.pathname._0_4_;
        *(undefined4 *)((long)&pdVar20->pathname + 4) = local_198.pathname._4_4_;
        pDVar37 = p->code_shifts;
        iVar30 = (*pDVar18->scanner_code)
                           (&p->shift_results[uVar51].loc,&pDVar37[iVar42].symbol,
                            &pDVar37[iVar42].term_priority,&pDVar37[iVar42].op_assoc,
                            &pDVar37[iVar42].op_priority);
        if (iVar30 != 0) {
          pSVar36 = p->shift_results;
          pSVar36[uVar51].snode = pSVar52->snode;
          uVar55 = (ulong)(iVar40 + 1);
          pSVar36[uVar51].shift = p->code_shifts + iVar42;
          iVar42 = iVar42 + 1;
        }
      }
      if (pDVar18->scanner_table != (void *)0x0) {
        iVar40 = (int)uVar55;
        uVar49 = scan_buffer(&local_198,pDVar18,p->shift_results + uVar55);
        if (uVar49 != 0) {
          pSVar31 = pSVar52->snode;
          pSVar36 = p->shift_results;
          uVar51 = (ulong)uVar49;
          do {
            pSVar36[uVar55].snode = pSVar31;
            uVar55 = (ulong)((int)uVar55 + 1);
            uVar51 = uVar51 - 1;
          } while (uVar51 != 0);
        }
        uVar55 = (ulong)(iVar40 + uVar49);
      }
      pSVar52 = *ppSVar5;
      uVar51 = uVar55;
    } while (pSVar52 != (Shift *)0x0);
    iVar42 = (int)uVar55;
    if (iVar42 != 0) {
      pSVar36 = p->shift_results;
      ppDVar41 = &pSVar36[1].shift;
      lVar45 = 0;
      uVar51 = 0;
      do {
        iVar42 = iVar42 + -1;
        pDVar37 = pSVar36[uVar51].shift;
        if (pDVar37 != (D_Shift *)0x0) {
          pSVar46 = pSVar36 + uVar51;
          if (pDVar37->shift_kind == '\x03') {
            uVar8 = pDVar37->symbol;
            pSVar31 = pSVar46->snode;
            pSVar46->shift = (D_Shift *)0x0;
            ppDVar56 = ppDVar41;
            iVar40 = iVar42;
            if (uVar51 + 1 < uVar55) {
              do {
                pDVar37 = *ppDVar56;
                if (((pDVar37 != (D_Shift *)0x0) &&
                    (pSVar31 == ((ShiftResult *)(ppDVar56 + -1))->snode)) &&
                   (uVar8 == pDVar37->symbol)) {
                  pSVar46->shift = pDVar37;
                  *ppDVar56 = (D_Shift *)0x0;
                }
                iVar40 = iVar40 + -1;
                ppDVar56 = ppDVar56 + 6;
              } while (iVar40 != 0);
            }
          }
          if ((pSVar46->shift != (D_Shift *)0x0) && (pSVar46->shift->term_priority != 0)) {
            lVar48 = 0;
            do {
              lVar19 = *(long *)((long)&pSVar36->shift + lVar48);
              if (((lVar19 != 0) && (lVar45 != lVar48)) &&
                 ((pSVar46->loc).s == *(char **)((long)&(pSVar36->loc).s + lVar48))) {
                iVar40 = *(int *)(lVar19 + 8);
                iVar30 = pSVar46->shift->term_priority;
                if (iVar30 < iVar40) {
                  pSVar46->shift = (D_Shift *)0x0;
                  break;
                }
                if (iVar40 < iVar30) {
                  *(undefined8 *)((long)&pSVar36->shift + lVar48) = 0;
                }
              }
              lVar48 = lVar48 + 0x30;
            } while (uVar55 * 0x30 != lVar48);
          }
        }
        uVar51 = uVar51 + 1;
        ppDVar41 = ppDVar41 + 6;
        lVar45 = lVar45 + 0x30;
      } while (uVar51 != uVar55);
      lVar45 = 0;
      do {
        pSVar36 = p->shift_results;
        pDVar37 = *(D_Shift **)((long)&pSVar36->shift + lVar45);
        if (pDVar37 != (D_Shift *)0x0) {
          p->shifts = p->shifts + 1;
          pdVar20 = *(d_loc_t **)((long)&pSVar36->snode + lVar45);
          pPVar32 = add_PNode(p,(uint)pDVar37->symbol,pdVar20,
                              *(char **)((long)&(pSVar36->loc).s + lVar45),
                              *(PNode **)&pdVar20[1].col,(D_Reduction *)0x0,(VecZNode *)0x0,pDVar37)
          ;
          if (pPVar32 != (PNode *)0x0) {
            plVar58 = (long *)((long)&(pSVar36->loc).s + lVar45);
            if ((local_158.s == (char *)0x0) || (local_158.s != (char *)*plVar58)) {
              local_158.s = (char *)*plVar58;
              local_158.pathname._0_4_ = *(undefined4 *)((long)&(pSVar36->loc).pathname + lVar45);
              local_158.pathname._4_4_ =
                   *(undefined4 *)((long)&(pSVar36->loc).pathname + lVar45 + 4);
              local_158.ws = *(char **)((long)&(pSVar36->loc).ws + lVar45);
              local_158.col = *(int *)((long)&(pSVar36->loc).col + lVar45);
              local_158.line = *(int *)((long)&(pSVar36->loc).line + lVar45);
              (*(p->user).initial_white_space_fn)(&p->user,&local_158,(void **)p);
              local_158.ws = (char *)*plVar58;
              pPVar32->ws_before = local_198.ws;
              pPVar32->ws_after = local_158.s;
            }
            goto_PNode(p,&local_158,pPVar32,*(SNode **)((long)&pSVar36->snode + lVar45));
          }
        }
        lVar45 = lVar45 + 0x30;
      } while (uVar55 * 0x30 != lVar45);
    }
    do {
      pSVar31 = pSVar50->snode;
      if ((pSVar31->loc).s != pcVar10) break;
      pSVar52 = pSVar50->next;
      puVar1 = &pSVar31->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_SNode(p,pSVar31);
      }
      pSVar50->next = p->free_shifts;
      p->free_shifts = pSVar50;
      pSVar50 = pSVar52;
    } while (pSVar52 != (Shift *)0x0);
    iVar42 = iVar29;
    if (((bVar22) && (pRVar35 = p->reductions_todo, pRVar35 != (Reduction *)0x0)) &&
       (pRVar35->next == (Reduction *)0x0)) {
      iVar40 = commit_stack(p,pRVar35->snode);
      iVar42 = 0;
      if (iVar40 == -4) {
        return -1;
      }
    }
  }
  goto LAB_00144a12;
}

Assistant:

static int exhaustive_parse(Parser *p, int state) {
  Reduction *r;
  char *pos, *epos = NULL;
  PNode *pn, tpn;
  SNode *sn;
  ZNode *z;
  int progress = 0, ready = 0;
  d_loc_t loc;

  pos = p->user.loc.ws = p->user.loc.s = p->start;
  loc = p->user.loc;
  p->user.initial_white_space_fn((D_Parser *)p, &loc, &p->user.initial_globals);
  /* initial state */
  sn = add_SNode(p, &p->t->state[state], &loc, p->top_scope);
  memset(&tpn, 0, sizeof(tpn));
  tpn.initial_scope = tpn.parse_node.scope = p->top_scope;
  tpn.parse_node.end = loc.s;
  if (sn->last_pn) unref_pn(p, sn->last_pn);
  pn = add_PNode(p, 0, &loc, loc.s, &tpn, 0, 0, 0);
  ref_pn(pn);
  sn->last_pn = pn;
  set_add_znode(&sn->zns, (z = new_ZNode(p, pn)));
  while (1) {
    /* reduce all */
    while (p->reductions_todo) {
      pos = p->reductions_todo->snode->loc.s;
      if (p->shifts_todo && p->shifts_todo->snode->loc.s < pos) break;
      if (pos > epos) {
        epos = pos;
        free_old_nodes(p);
      }
      for (; (r = p->reductions_todo) && r->snode->loc.s == pos;) {
        p->reductions_todo = p->reductions_todo->next;
        reduce_one(p, r);
      }
    }
    /* done? */
    if (!p->shifts_todo) {
      if (p->accept && (p->accept->loc.s == p->end || p->user.partial_parses))
        return 0;
      else {
        if (error_recovery(p)) return 1;
        continue;
      }
    } else if (!p->user.dont_compare_stacks && p->shifts_todo->next)
      cmp_stacks(p);
    /* shift all */
    pos = p->shifts_todo->snode->loc.s;
    if (pos > epos) {
      epos = pos;
      free_old_nodes(p);
    }
    progress++;
    ready = progress > p->user.commit_actions_interval;
    if (ready && !p->shifts_todo->next && !p->reductions_todo) {
      if (commit_stack(p, p->shifts_todo->snode) == -4)
        return -1;
      ready = progress = 0;
    }
    shift_all(p, pos);
    if (ready && p->reductions_todo && !p->reductions_todo->next) {
      if (commit_stack(p, p->reductions_todo->snode) == -4)
        return -1;
      progress = 0;
    }
  }
}